

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initiator.cpp
# Opt level: O2

bool __thiscall FIX::Initiator::isLoggedOn(Initiator *this)

{
  _Rb_tree_header *p_Var1;
  Session *pSVar2;
  _Base_ptr p_Var3;
  SessionIDs connected;
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  local_50;
  
  Mutex::lock(&this->m_mutex);
  std::
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  ::_Rb_tree(&local_50,&(this->m_connected)._M_t);
  p_Var1 = &local_50._M_impl.super__Rb_tree_header;
  for (p_Var3 = local_50._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != p_Var1; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    pSVar2 = Session::lookupSession((SessionID *)(p_Var3 + 1));
    if (((pSVar2->m_state).m_receivedLogon == true) && (((pSVar2->m_state).m_sentLogon & 1U) != 0))
    break;
  }
  std::
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  ::~_Rb_tree(&local_50);
  Mutex::unlock(&this->m_mutex);
  return (_Rb_tree_header *)p_Var3 != p_Var1;
}

Assistant:

bool Initiator::isLoggedOn() const {
  Locker l(m_mutex);

  SessionIDs connected = m_connected;
  SessionIDs::iterator i = connected.begin();
  for (; i != connected.end(); ++i) {
    if (Session::lookupSession(*i)->isLoggedOn()) {
      return true;
    }
  }
  return false;
}